

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O2

bool tinyusdz::tydra::detail::ExportSkelAnimation(Animation *anim,SkelAnimation *dst,string *err)

{
  _Rb_tree_node_base *p_Var1;
  pointer pqVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  pointer paVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  half hVar12;
  half hVar13;
  half hVar14;
  _Base_ptr p_Var15;
  uint64_t uVar16;
  size_type sVar17;
  size_type sVar18;
  size_type sVar19;
  _Rb_tree_node_base *p_Var20;
  mapped_type *pmVar21;
  size_type sVar22;
  value_type_conflict1 *pvVar23;
  ostream *poVar24;
  mapped_type *pmVar25;
  mapped_type *pmVar26;
  value_type *pvVar27;
  const_iterator cVar28;
  mapped_type *this;
  value_type *pvVar29;
  _Base_ptr p_Var30;
  byte bVar31;
  size_t sVar32;
  byte bVar33;
  bool bVar34;
  size_type sVar35;
  char *pcVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  size_t t_3;
  ulong uVar37;
  size_t t;
  long lVar38;
  _Base_ptr *this_00;
  bool bVar39;
  pointer paVar40;
  _Base_ptr this_01;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> static_txs;
  uint64_t joint_id;
  SkelAnimation *local_458;
  undefined1 local_450 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  allocator local_421;
  _Rb_tree_node_base *local_420;
  mapped_type *local_418;
  float tc;
  map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  ts_txs;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translations;
  __node_base_ptr p_Stack_398;
  unsigned_long local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  ostringstream ss_e;
  half hStack_346;
  half hStack_344;
  undefined2 uStack_342;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> local_328 [10];
  StringAndIdMap joint_idMap;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::_M_assign((string *)dst);
  if ((anim->display_name)._M_string_length != 0) {
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&(dst->meta).displayName,&anim->display_name);
  }
  if ((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00277d31:
    if ((anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (dst->blendShapeWeights)._value_empty = true;
    }
    else {
      joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header;
      joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header;
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_450 = (undefined1  [8])
                  &(anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header;
      local_458 = dst;
      joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var15 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left; (undefined1  [8])p_Var15 != local_450;
          p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
        sVar32 = joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          sVar32 = 0;
        }
        StringAndIdMap::add(&joint_idMap,(string *)(p_Var15 + 1),sVar32);
      }
      sVar35 = 0;
      if (joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        sVar35 = joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints,sVar35,
                 (allocator_type *)&ss_e);
      for (p_Var15 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left; (undefined1  [8])p_Var15 != local_450;
          p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
        Token::Token((Token *)&ss_e,(string *)(p_Var15 + 1));
        ::std::__cxx11::string::string((string *)&local_130,(string *)(p_Var15 + 1));
        uVar16 = StringAndIdMap::at(&joint_idMap,&local_130);
        ::std::__cxx11::string::operator=
                  ((string *)
                   (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar16),(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      nonstd::optional_lite::optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
      ::operator=((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                  &(local_458->blendShapes)._attrib,
                  (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints);
      translations.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&p_Stack_398;
      translations.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1;
      translations.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Stack_398 = (__node_base_ptr)0x0;
      p_Var15 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar37 = 0; p_Var30 = p_Var15[2]._M_parent,
          uVar37 < (ulong)((long)p_Var15[2]._M_left - (long)p_Var30 >> 3); uVar37 = uVar37 + 1) {
        _ss_e = (pointer)CONCAT44(_hStack_344,(&p_Var30->_M_color)[uVar37 * 2]);
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&translations,(value_type *)&ss_e);
      }
      ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &ts_txs._M_t._M_impl.super__Rb_tree_header._M_header;
      ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ts_txs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (paVar40 = translations.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage; paVar40 != (pointer)0x0;
          paVar40 = *(pointer *)paVar40->_M_elems) {
        fVar7 = paVar40->_M_elems[2];
        _ss_e = (pointer)0x7ff8000000000000;
        if (!NAN(fVar7)) {
          if (ABS(fVar7) == INFINITY) {
            _ss_e = (pointer)0xfff0000000000000;
            if (-1 < (int)fVar7) {
              _ss_e = (pointer)0x7ff0000000000000;
            }
          }
          else {
            _ss_e = (pointer)(double)fVar7;
          }
        }
        pmVar21 = ::std::
                  map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&ts_txs,(key_type_conflict3 *)&ss_e);
        ::std::vector<float,_std::allocator<float>_>::resize
                  (pmVar21,(long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
      }
      static_txs.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      static_txs.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      static_txs.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (p_Var15 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left; (undefined1  [8])p_Var15 != local_450;
          p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
        p_Var20 = p_Var15 + 1;
        p_Var30 = p_Var15[2]._M_parent;
        for (uVar37 = 0; uVar37 < (ulong)((long)p_Var15[2]._M_left - (long)p_Var30 >> 3);
            uVar37 = uVar37 + 1) {
          joint_id = CONCAT44(joint_id._4_4_,(&p_Var30->_M_color)[uVar37 * 2]);
          _ss_e = (pointer)CONCAT44(_hStack_344,(&p_Var30->_M_color)[uVar37 * 2]);
          sVar22 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&translations,(key_type_conflict1 *)&ss_e);
          if (sVar22 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar24 = ::std::operator<<(poVar24,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                       );
            poVar24 = ::std::operator<<(poVar24,":");
            poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
            poVar24 = ::std::operator<<(poVar24,"():");
            poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0x206);
            ::std::operator<<(poVar24," ");
            ::std::__cxx11::string::string
                      ((string *)&local_388,
                       "All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}"
                       ,(allocator *)&local_390);
            fmt::format<float,std::__cxx11::string>
                      (&local_368,(fmt *)&local_388,(string *)&joint_id,(float *)p_Var20,in_R8);
            poVar24 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar24,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_368,&local_388,"\n");
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&static_txs);
            ::std::
            _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                         *)&ts_txs);
LAB_00278379:
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&translations);
            goto LAB_00278544;
          }
          ::std::__cxx11::string::string((string *)&local_150,(string *)p_Var20);
          uVar16 = StringAndIdMap::at(&joint_idMap,&local_150);
          ::std::__cxx11::string::_M_dispose();
          _ss_e = (pointer)0x7ff8000000000000;
          if (!NAN((float)joint_id)) {
            if (ABS((float)joint_id) == INFINITY) {
              _ss_e = (pointer)0xfff0000000000000;
              if (-1 < (int)(float)joint_id) {
                _ss_e = (pointer)0x7ff0000000000000;
              }
            }
            else {
              _ss_e = (pointer)(double)(float)joint_id;
            }
          }
          pmVar21 = ::std::
                    map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::at((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)&ts_txs,(key_type_conflict3 *)&ss_e);
          p_Var30 = p_Var15[2]._M_parent;
          (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar16] = *(float *)(&p_Var30->field_0x4 + uVar37 * 8);
        }
        if ((char)p_Var15[2]._M_color == _S_black) {
          ::std::__cxx11::string::string((string *)&local_170,(string *)p_Var20);
          uVar16 = StringAndIdMap::at(&joint_idMap,&local_170);
          ::std::__cxx11::string::_M_dispose();
          if ((ulong)((long)static_txs.
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)static_txs.
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) < uVar16 + 1) {
            ::std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)&static_txs,uVar16 + 1);
          }
          pvVar23 = nonstd::optional_lite::optional<float>::value((optional<float> *)(p_Var15 + 2));
          (static_txs.
           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar16] = *pvVar23;
        }
      }
      local_328[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_328[0]._17_8_ = 0;
      local_328[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_328[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      _ss_e = (pointer)0x0;
      if ((long)static_txs.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)static_txs.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 2 ==
          (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                .super__Vector_impl_data._M_start >> 5) {
        Animatable<std::vector<float,_std::allocator<float>_>_>::set
                  ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&ss_e,
                   (vector<float,_std::allocator<float>_> *)&static_txs);
      }
      for (p_Var15 = ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left; dst = local_458,
          (_Rb_tree_header *)p_Var15 != &ts_txs._M_t._M_impl.super__Rb_tree_header;
          p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
        TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::add_sample
                  (local_328,*(double *)(p_Var15 + 1),
                   (vector<float,_std::allocator<float>_> *)&p_Var15[1]._M_parent);
      }
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>>::operator=
                ((optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>> *)
                 &(local_458->blendShapeWeights)._attrib,
                 (Animatable<std::vector<float,_std::allocator<float>_>_> *)&ss_e);
      Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
                ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&ss_e);
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&static_txs);
      ::std::
      _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)&ts_txs);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&translations);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints);
      StringAndIdMap::~StringAndIdMap(&joint_idMap);
    }
    ::std::__cxx11::string::_M_assign((string *)dst);
    if ((anim->display_name)._M_string_length == 0) {
      return true;
    }
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&(dst->meta).displayName,&anim->display_name);
    return true;
  }
  joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header;
  joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header;
  joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450 = (undefined1  [8])&(anim->channels_map)._M_t._M_impl.super__Rb_tree_header;
  local_458 = dst;
  joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var15 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (undefined1  [8])p_Var15 != local_450; p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)
      ) {
    sVar32 = joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      sVar32 = 0;
    }
    StringAndIdMap::add(&joint_idMap,(string *)(p_Var15 + 1),sVar32);
  }
  sVar35 = 0;
  if (joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    sVar35 = joint_idMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints,sVar35,
             (allocator_type *)&ss_e);
  for (p_Var15 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (undefined1  [8])p_Var15 != local_450; p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)
      ) {
    Token::Token((Token *)&ss_e,(string *)(p_Var15 + 1));
    ::std::__cxx11::string::string((string *)&local_50,(string *)(p_Var15 + 1));
    uVar16 = StringAndIdMap::at(&joint_idMap,&local_50);
    ::std::__cxx11::string::operator=
              ((string *)
               (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                .super__Vector_impl_data._M_start + uVar16),(string *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  nonstd::optional_lite::optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
  operator=((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
            &(local_458->joints)._attrib,
            (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints);
  bVar31 = 1;
  bVar34 = true;
  bVar39 = true;
  bVar33 = 1;
  bVar10 = true;
  bVar11 = true;
  p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((undefined1  [8])p_Var20 != local_450) {
    p_Var1 = p_Var20 + 2;
    _ss_e = 1;
    local_420 = p_Var20;
    sVar17 = ::std::
             map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
             ::count((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                      *)p_Var1,(key_type *)&ss_e);
    local_418 = (mapped_type *)CONCAT71(local_418._1_7_,bVar31);
    _ss_e = 2;
    sVar18 = ::std::
             map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
             ::count((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                      *)p_Var1,(key_type *)&ss_e);
    _ss_e = (pointer)CONCAT44(_hStack_344,3);
    sVar19 = ::std::
             map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
             ::count((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                      *)p_Var1,(key_type *)&ss_e);
    bVar39 = (bool)(bVar39 & sVar17 != 0);
    bVar11 = (bool)(bVar11 & sVar17 == 0);
    bVar34 = (bool)(bVar34 & sVar18 != 0);
    bVar10 = (bool)(bVar10 & sVar18 == 0);
    bVar31 = (byte)local_418 & sVar19 != 0;
    bVar33 = bVar33 & sVar19 == 0;
    p_Var20 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(local_420);
  }
  if (bVar39 || bVar11) {
    if (bVar34 || bVar10) {
      if (bVar31 != 0 || bVar33 != 0) {
        local_418 = (mapped_type *)CONCAT71(local_418._1_7_,bVar33);
        if (bVar11) {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          _ss_e = (pointer)0x3f8000003f800000;
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
          _M_fill_assign((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *
                         )&translations.
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ,(long)joints.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)joints.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&ss_e);
          Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          ::Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                        *)&ss_e,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 *)&translations.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      );
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                       *)&(local_458->translations)._attrib,
                      (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       *)&ss_e);
          Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          ::~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&ss_e);
          ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
          ~_Vector_base(&translations.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       );
        }
        else {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&p_Stack_398;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p_Stack_398 = (__node_base_ptr)0x0;
          _ss_e = (pointer)CONCAT44(_hStack_344,1);
          cVar28 = ::std::
                   _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                           *)((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 2),(key_type *)&ss_e);
          if (cVar28._M_node !=
              (_Base_ptr)
              &(anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2].
               _M_parent) {
            lVar38 = 0;
            uVar37 = 0;
            while( true ) {
              if ((ulong)((long)cVar28._M_node[5]._M_left - (long)cVar28._M_node[5]._M_parent >> 4)
                  <= uVar37) break;
              _ss_e = (pointer)CONCAT44(_hStack_344,
                                        *(undefined4 *)
                                         ((long)&(cVar28._M_node[5]._M_parent)->_M_color + lVar38));
              ::std::__detail::
              _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&translations,(value_type *)&ss_e);
              uVar37 = uVar37 + 1;
              lVar38 = lVar38 + 0x10;
            }
          }
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &ts_txs._M_t._M_impl.super__Rb_tree_header._M_header;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (paVar40 = translations.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; paVar40 != (pointer)0x0
              ; paVar40 = *(pointer *)paVar40->_M_elems) {
            fVar7 = paVar40->_M_elems[2];
            _ss_e = (pointer)0x7ff8000000000000;
            if (!NAN(fVar7)) {
              if (ABS(fVar7) == INFINITY) {
                _ss_e = (pointer)0xfff0000000000000;
                if (-1 < (int)fVar7) {
                  _ss_e = (pointer)0x7ff0000000000000;
                }
              }
              else {
                _ss_e = (pointer)(double)fVar7;
              }
            }
            pmVar25 = ::std::
                      map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                      ::operator[](&ts_txs,(key_type_conflict3 *)&ss_e);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                      (pmVar25,(long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
          }
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (undefined1  [8])p_Var20 != local_450;
              p_Var20 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var20)) {
            _ss_e = (pointer)CONCAT44(_hStack_344,1);
            cVar28 = ::std::
                     _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                     ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                             *)(p_Var20 + 2),(key_type *)&ss_e);
            if (cVar28._M_node != (_Base_ptr)&p_Var20[2]._M_parent) {
              p_Var1 = p_Var20 + 1;
              lVar38 = 0;
              for (uVar37 = 0;
                  uVar37 < (ulong)((long)cVar28._M_node[5]._M_left -
                                   (long)cVar28._M_node[5]._M_parent >> 4); uVar37 = uVar37 + 1) {
                tc = *(float *)((long)&(cVar28._M_node[5]._M_parent)->_M_color + lVar38);
                _ss_e = (pointer)CONCAT44(_hStack_344,tc);
                sVar22 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&translations,(key_type_conflict1 *)&ss_e);
                if (sVar22 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar24 = ::std::operator<<(poVar24,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                             );
                  poVar24 = ::std::operator<<(poVar24,":");
                  poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
                  poVar24 = ::std::operator<<(poVar24,"():");
                  poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0x127);
                  ::std::operator<<(poVar24," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_388,
                             "All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}"
                             ,(allocator *)&joint_id);
                  fmt::format<float,std::__cxx11::string>
                            (&local_368,(fmt *)&local_388,(string *)&tc,(float *)p_Var1,in_R8);
LAB_00278f93:
                  poVar24 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
                  ::std::operator<<(poVar24,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+(&local_368,&local_388,"\n");
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::
                  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  ~_Vector_base(&static_txs.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               );
                  ::std::
                  _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                  ::~_Rb_tree(&ts_txs._M_t);
                  goto LAB_00278379;
                }
                ::std::__cxx11::string::string((string *)&local_70,(string *)p_Var1);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_70);
                ::std::__cxx11::string::_M_dispose();
                _ss_e = (pointer)0x7ff8000000000000;
                if (!NAN(tc)) {
                  if (ABS(tc) == INFINITY) {
                    _ss_e = (pointer)0xfff0000000000000;
                    if (-1 < (int)tc) {
                      _ss_e = (pointer)0x7ff0000000000000;
                    }
                  }
                  else {
                    _ss_e = (pointer)(double)tc;
                  }
                }
                joint_id = uVar16;
                pmVar25 = ::std::
                          map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                          ::at(&ts_txs,(key_type_conflict3 *)&ss_e);
                paVar40 = (pmVar25->
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(((long)(pmVar25->
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)paVar40) /
                           0xc) < uVar16) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar24 = ::std::operator<<(poVar24,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                             );
                  poVar24 = ::std::operator<<(poVar24,":");
                  poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
                  poVar24 = ::std::operator<<(poVar24,"():");
                  poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0x12e);
                  ::std::operator<<(poVar24," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_388,
                             "Internal error. joint_id {} exceeds # of joints {}",&local_421);
                  local_390 = ((long)(pmVar25->
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pmVar25->
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) / 0xc;
                  fmt::format<unsigned_long,unsigned_long>
                            (&local_368,(fmt *)&local_388,(string *)&joint_id,&local_390,
                             (unsigned_long *)in_R8);
                  goto LAB_00278f93;
                }
                p_Var15 = cVar28._M_node[5]._M_parent;
                paVar40[uVar16]._M_elems[2] = *(float *)((long)&p_Var15->_M_parent + lVar38 + 4);
                *(undefined8 *)paVar40[uVar16]._M_elems =
                     *(undefined8 *)(&p_Var15->field_0x4 + lVar38);
                lVar38 = lVar38 + 0x10;
              }
              if (*(char *)&cVar28._M_node[4]._M_right == '\x01') {
                ::std::__cxx11::string::string((string *)&local_90,(string *)p_Var1);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_90);
                ::std::__cxx11::string::_M_dispose();
                if ((ulong)(((long)static_txs.
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)static_txs.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0xc) < uVar16 + 1) {
                  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  resize(&static_txs,uVar16 + 1);
                }
                pvVar29 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                    ((optional<std::array<float,_3UL>_> *)
                                     &cVar28._M_node[4]._M_right);
                *(undefined8 *)
                 static_txs.
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems =
                     *(undefined8 *)pvVar29->_M_elems;
                static_txs.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[2] = pvVar29->_M_elems[2]
                ;
              }
            }
          }
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_328[0]._17_8_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _ss_e = (pointer)0x0;
          if (((long)static_txs.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)static_txs.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc ==
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) {
            Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::set((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                   *)&ss_e,&static_txs);
          }
          for (p_Var15 = ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var15 != &ts_txs._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
            TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::add_sample((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                          *)local_328,*(double *)(p_Var15 + 1),
                         (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *
                         )&p_Var15[1]._M_parent);
          }
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                       *)&(local_458->translations)._attrib,
                      (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       *)&ss_e);
          Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          ::~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&ss_e);
          ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
          ~_Vector_base(&static_txs.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       );
          ::std::
          _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
          ::~_Rb_tree(&ts_txs._M_t);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&translations);
        }
        if (bVar10) {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ts_txs._M_t._M_impl._0_8_ = 0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
          ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
          _M_fill_assign((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &translations,
                         (long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&ts_txs)
          ;
          Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
          ::Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        *)&ss_e,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 *)&translations);
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                       *)&(local_458->rotations)._attrib,
                      (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                       *)&ss_e);
          Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
          ::~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                         *)&ss_e);
          ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
          ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         *)&translations);
        }
        else {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&p_Stack_398;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p_Stack_398 = (__node_base_ptr)0x0;
          _ss_e = (pointer)CONCAT44(_hStack_344,2);
          cVar28 = ::std::
                   _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                           *)((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 2),(key_type *)&ss_e);
          if (cVar28._M_node !=
              (_Base_ptr)
              &(anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2].
               _M_parent) {
            lVar38 = 0;
            for (uVar37 = 0;
                uVar37 < (ulong)(((long)cVar28._M_node[7]._M_parent - *(long *)(cVar28._M_node + 7))
                                / 0x14); uVar37 = uVar37 + 1) {
              _ss_e = (pointer)CONCAT44(_hStack_344,
                                        *(undefined4 *)(*(long *)(cVar28._M_node + 7) + lVar38));
              ::std::__detail::
              _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&translations,(value_type *)&ss_e);
              lVar38 = lVar38 + 0x14;
            }
          }
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &ts_txs._M_t._M_impl.super__Rb_tree_header._M_header;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (paVar40 = translations.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; paVar40 != (pointer)0x0
              ; paVar40 = *(pointer *)paVar40->_M_elems) {
            fVar7 = paVar40->_M_elems[2];
            _ss_e = (pointer)0x7ff8000000000000;
            if (!NAN(fVar7)) {
              if (ABS(fVar7) == INFINITY) {
                _ss_e = (pointer)0xfff0000000000000;
                if (-1 < (int)fVar7) {
                  _ss_e = (pointer)0x7ff0000000000000;
                }
              }
              else {
                _ss_e = (pointer)(double)fVar7;
              }
            }
            pmVar26 = ::std::
                      map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                      ::operator[]((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                    *)&ts_txs,(key_type_conflict3 *)&ss_e);
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::resize
                      (pmVar26,(long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
          }
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (p_Var15 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (undefined1  [8])p_Var15 != local_450;
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
            _ss_e = (pointer)CONCAT44(_hStack_344,2);
            cVar28 = ::std::
                     _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                     ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                             *)(p_Var15 + 2),(key_type *)&ss_e);
            if (cVar28._M_node != (_Base_ptr)&p_Var15[2]._M_parent) {
              p_Var20 = p_Var15 + 1;
              lVar38 = 0;
              for (uVar37 = 0;
                  uVar37 < (ulong)(((long)cVar28._M_node[7]._M_parent -
                                   *(long *)(cVar28._M_node + 7)) / 0x14); uVar37 = uVar37 + 1) {
                uVar6 = *(undefined4 *)(*(long *)(cVar28._M_node + 7) + lVar38);
                joint_id = CONCAT44(joint_id._4_4_,uVar6);
                _ss_e = (pointer)CONCAT44(_hStack_344,uVar6);
                sVar22 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&translations,(key_type_conflict1 *)&ss_e);
                if (sVar22 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar24 = ::std::operator<<(poVar24,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                             );
                  poVar24 = ::std::operator<<(poVar24,":");
                  poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
                  poVar24 = ::std::operator<<(poVar24,"():");
                  poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0x171);
                  ::std::operator<<(poVar24," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_388,
                             "All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}"
                             ,(allocator *)&local_390);
                  fmt::format<float,std::__cxx11::string>
                            (&local_368,(fmt *)&local_388,(string *)&joint_id,(float *)p_Var20,in_R8
                            );
                  poVar24 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
                  ::std::operator<<(poVar24,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+(&local_368,&local_388,"\n");
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::
                  _Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                  ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 *)&static_txs);
                  ::std::
                  _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                               *)&ts_txs);
                  goto LAB_00278379;
                }
                ::std::__cxx11::string::string((string *)&local_b0,(string *)p_Var20);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_b0);
                ::std::__cxx11::string::_M_dispose();
                _ss_e = (pointer)0x7ff8000000000000;
                if (!NAN((float)joint_id)) {
                  if (ABS((float)joint_id) == INFINITY) {
                    _ss_e = (pointer)0xfff0000000000000;
                    if (-1 < (int)(float)joint_id) {
                      _ss_e = (pointer)0x7ff0000000000000;
                    }
                  }
                  else {
                    _ss_e = (pointer)(double)(float)joint_id;
                  }
                }
                pmVar26 = ::std::
                          map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                          ::at((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                *)&ts_txs,(key_type_conflict3 *)&ss_e);
                puVar3 = (undefined8 *)(*(long *)(cVar28._M_node + 7) + 4 + lVar38);
                uVar9 = puVar3[1];
                pqVar2 = (pmVar26->
                         super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar16;
                *(undefined8 *)(pqVar2->imag)._M_elems = *puVar3;
                *(undefined8 *)((pqVar2->imag)._M_elems + 2) = uVar9;
                lVar38 = lVar38 + 0x14;
              }
              if (*(char *)&cVar28._M_node[6]._M_parent == '\x01') {
                ::std::__cxx11::string::string((string *)&local_d0,(string *)p_Var20);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_d0);
                ::std::__cxx11::string::_M_dispose();
                if ((ulong)((long)static_txs.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)static_txs.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) < uVar16 + 1) {
                  ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                  resize((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &static_txs,uVar16 + 1);
                }
                this_00 = &cVar28._M_node[6]._M_parent;
                pvVar27 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                    ((optional<std::array<float,_4UL>_> *)this_00);
                fVar7 = pvVar27->_M_elems[0];
                pvVar27 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                    ((optional<std::array<float,_4UL>_> *)this_00);
                local_420 = (_Rb_tree_node_base *)CONCAT44(local_420._4_4_,pvVar27->_M_elems[1]);
                pvVar27 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                    ((optional<std::array<float,_4UL>_> *)this_00);
                fVar4 = pvVar27->_M_elems[2];
                pvVar27 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                    ((optional<std::array<float,_4UL>_> *)this_00);
                fVar5 = pvVar27->_M_elems[3];
                lVar38 = uVar16 * 0x10;
                *(float *)((long)static_txs.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar38) = fVar7;
                *(undefined4 *)
                 ((long)static_txs.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar38 + 4) = local_420._0_4_;
                *(float *)((long)static_txs.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar38 + 8) = fVar4;
                *(float *)((long)static_txs.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar38 + 0xc) = fVar5;
              }
            }
          }
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_328[0]._17_8_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _ss_e = (pointer)0x0;
          if ((long)static_txs.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)static_txs.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4 ==
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) {
            Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::set((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                   *)&ss_e,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)&static_txs);
          }
          for (p_Var15 = ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var15 != &ts_txs._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
            TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          *)local_328,*(double *)(p_Var15 + 1),
                         (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &p_Var15[1]._M_parent);
          }
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                       *)&(local_458->rotations)._attrib,
                      (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                       *)&ss_e);
          Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
          ::~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                         *)&ss_e);
          ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
          ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         *)&static_txs);
          ::std::
          _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                       *)&ts_txs);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&translations);
        }
        if (((ulong)local_418 & 1) == 0) {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&p_Stack_398;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p_Stack_398 = (__node_base_ptr)0x0;
          _ss_e = (pointer)CONCAT44(_hStack_344,3);
          cVar28 = ::std::
                   _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                           *)((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 2),(key_type *)&ss_e);
          if (cVar28._M_node !=
              (_Base_ptr)
              &(anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2].
               _M_parent) {
            lVar38 = 0;
            for (uVar37 = 0;
                uVar37 < (ulong)((long)cVar28._M_node[8]._M_right - (long)cVar28._M_node[8]._M_left
                                >> 4); uVar37 = uVar37 + 1) {
              _ss_e = (pointer)CONCAT44(_hStack_344,
                                        *(undefined4 *)
                                         ((long)&(cVar28._M_node[8]._M_left)->_M_color + lVar38));
              ::std::__detail::
              _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&translations,(value_type *)&ss_e);
              lVar38 = lVar38 + 0x10;
            }
          }
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &ts_txs._M_t._M_impl.super__Rb_tree_header._M_header;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (paVar40 = translations.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; paVar40 != (pointer)0x0
              ; paVar40 = *(pointer *)paVar40->_M_elems) {
            fVar7 = paVar40->_M_elems[2];
            _ss_e = (pointer)0x7ff8000000000000;
            if (!NAN(fVar7)) {
              if (ABS(fVar7) == INFINITY) {
                _ss_e = (pointer)0xfff0000000000000;
                if (-1 < (int)fVar7) {
                  _ss_e = (pointer)0x7ff0000000000000;
                }
              }
              else {
                _ss_e = (pointer)(double)fVar7;
              }
            }
            this = ::std::
                   map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                   ::operator[]((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                 *)&ts_txs,(key_type_conflict3 *)&ss_e);
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::resize(this,(long)joints.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)joints.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5);
          }
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          static_txs.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (p_Var20 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (undefined1  [8])p_Var20 != local_450;
              p_Var20 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var20)) {
            _ss_e = (pointer)CONCAT44(_hStack_344,3);
            cVar28 = ::std::
                     _Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                     ::find((_Rb_tree<tinyusdz::tydra::AnimationChannel::ChannelType,_std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>,_std::_Select1st<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                             *)(p_Var20 + 2),(key_type *)&ss_e);
            if (cVar28._M_node != (_Base_ptr)&p_Var20[2]._M_parent) {
              p_Var1 = p_Var20 + 1;
              lVar38 = 0;
              local_420 = p_Var20;
              for (uVar37 = 0;
                  uVar37 < (ulong)((long)cVar28._M_node[8]._M_right -
                                   (long)cVar28._M_node[8]._M_left >> 4); uVar37 = uVar37 + 1) {
                uVar6 = *(undefined4 *)((long)&(cVar28._M_node[8]._M_left)->_M_color + lVar38);
                joint_id = CONCAT44(joint_id._4_4_,uVar6);
                _ss_e = (pointer)CONCAT44(_hStack_344,uVar6);
                sVar22 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&translations,(key_type_conflict1 *)&ss_e);
                if (sVar22 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar24 = ::std::operator<<(poVar24,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                             );
                  poVar24 = ::std::operator<<(poVar24,":");
                  poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
                  poVar24 = ::std::operator<<(poVar24,"():");
                  poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0x1bd);
                  ::std::operator<<(poVar24," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_388,
                             "All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}"
                             ,(allocator *)&local_390);
                  fmt::format<float,std::__cxx11::string>
                            (&local_368,(fmt *)&local_388,(string *)&joint_id,(float *)p_Var1,in_R8)
                  ;
                  poVar24 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
                  ::std::operator<<(poVar24,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+(&local_368,&local_388,"\n");
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::
                  _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&static_txs);
                  ::std::
                  _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                               *)&ts_txs);
                  goto LAB_00278379;
                }
                ::std::__cxx11::string::string((string *)&local_f0,(string *)p_Var1);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_f0);
                ::std::__cxx11::string::_M_dispose();
                _ss_e = (pointer)0x7ff8000000000000;
                if (!NAN((float)joint_id)) {
                  if (ABS((float)joint_id) == INFINITY) {
                    _ss_e = (pointer)0xfff0000000000000;
                    if (-1 < (int)(float)joint_id) {
                      _ss_e = (pointer)0x7ff0000000000000;
                    }
                  }
                  else {
                    _ss_e = (pointer)(double)(float)joint_id;
                  }
                }
                local_418 = ::std::
                            map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                            ::at((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                  *)&ts_txs,(key_type_conflict3 *)&ss_e);
                hVar12 = tinyusdz::value::float_to_half_full
                                   (*(float *)(&(cVar28._M_node[8]._M_left)->field_0x4 + lVar38));
                hVar13 = tinyusdz::value::float_to_half_full
                                   (*(float *)((long)&(cVar28._M_node[8]._M_left)->_M_parent +
                                              lVar38));
                hVar14 = tinyusdz::value::float_to_half_full
                                   (*(float *)((long)&(cVar28._M_node[8]._M_left)->_M_parent +
                                              lVar38 + 4));
                paVar8 = (local_418->
                         super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                paVar8[uVar16]._M_elems[0].value = hVar12.value;
                paVar8[uVar16]._M_elems[1].value = hVar13.value;
                paVar8[uVar16]._M_elems[2].value = hVar14.value;
                lVar38 = lVar38 + 0x10;
              }
              p_Var20 = local_420;
              if ((char)cVar28._M_node[8]._M_color == _S_black) {
                ::std::__cxx11::string::string((string *)&local_110,(string *)p_Var1);
                uVar16 = StringAndIdMap::at(&joint_idMap,&local_110);
                ::std::__cxx11::string::_M_dispose();
                if ((ulong)(((long)static_txs.
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)static_txs.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 6) < uVar16 + 1) {
                  ::std::
                  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&static_txs,uVar16 + 1);
                }
                this_01 = cVar28._M_node + 8;
                pvVar29 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                    ((optional<std::array<float,_3UL>_> *)this_01);
                hVar12 = tinyusdz::value::float_to_half_full(pvVar29->_M_elems[0]);
                pvVar29 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                    ((optional<std::array<float,_3UL>_> *)this_01);
                hVar13 = tinyusdz::value::float_to_half_full(pvVar29->_M_elems[1]);
                pvVar29 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                    ((optional<std::array<float,_3UL>_> *)this_01);
                hVar14 = tinyusdz::value::float_to_half_full(pvVar29->_M_elems[2]);
                lVar38 = uVar16 * 6;
                *(uint16_t *)
                 ((long)(static_txs.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar38) =
                     hVar12.value;
                *(uint16_t *)
                 ((long)(static_txs.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar38 + 2) =
                     hVar13.value;
                *(uint16_t *)
                 ((long)(static_txs.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar38 + 4) =
                     hVar14.value;
                p_Var20 = local_420;
              }
            }
          }
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_328[0]._17_8_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_328[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _ss_e = (pointer)0x0;
          if (((long)static_txs.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)static_txs.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 6 ==
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) {
            Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::set((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)&ss_e,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&static_txs);
          }
          for (p_Var15 = ts_txs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              dst = local_458,
              (_Rb_tree_header *)p_Var15 != &ts_txs._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
            TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::add_sample((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_328,*(double *)(p_Var15 + 1),
                         (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)&p_Var15[1]._M_parent);
          }
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                       *)&(local_458->scales)._attrib,
                      (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                       *)&ss_e);
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)&ss_e);
          ::std::
          _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           *)&static_txs);
          ::std::
          _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                       *)&ts_txs);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&translations);
        }
        else {
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          translations.
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar38 = (long)joints.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)joints.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          hVar12 = tinyusdz::value::float_to_half_full(1.0);
          _ss_e = (pointer)CONCAT62(_hStack_346,hVar12.value);
          hVar12 = tinyusdz::value::float_to_half_full(1.0);
          _ss_e = CONCAT22(hVar12.value,_ss_e);
          hVar12 = tinyusdz::value::float_to_half_full(1.0);
          _ss_e = CONCAT24(hVar12.value,_ss_e);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::_M_fill_assign((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&translations,lVar38 >> 5,(value_type *)&ss_e);
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        *)&ss_e,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                 *)&translations);
          dst = local_458;
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                       *)&(local_458->scales)._attrib,
                      (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                       *)&ss_e);
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)&ss_e);
          ::std::
          _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           *)&translations);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints);
        StringAndIdMap::~StringAndIdMap(&joint_idMap);
        goto LAB_00277d31;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar24 = ::std::operator<<(poVar24,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                 );
      poVar24 = ::std::operator<<(poVar24,":");
      poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
      poVar24 = ::std::operator<<(poVar24,"():");
      poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0xfb);
      ::std::operator<<(poVar24," ");
      pcVar36 = 
      "scale channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar24 = ::std::operator<<(poVar24,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                 );
      poVar24 = ::std::operator<<(poVar24,":");
      poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
      poVar24 = ::std::operator<<(poVar24,"():");
      poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0xf7);
      ::std::operator<<(poVar24," ");
      pcVar36 = 
      "rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
    }
    poVar24 = ::std::operator<<((ostream *)&ss_e,pcVar36);
    ::std::operator<<(poVar24,"\n");
    if (err == (string *)0x0) goto LAB_00278537;
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &translations,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts_txs,
                     "\n");
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar24 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar24 = ::std::operator<<(poVar24,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                               );
    poVar24 = ::std::operator<<(poVar24,":");
    poVar24 = ::std::operator<<(poVar24,"ExportSkelAnimation");
    poVar24 = ::std::operator<<(poVar24,"():");
    poVar24 = (ostream *)::std::ostream::operator<<(poVar24,0xf3);
    ::std::operator<<(poVar24," ");
    poVar24 = ::std::operator<<((ostream *)&ss_e,
                                "translation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
                               );
    ::std::operator<<(poVar24,"\n");
    if (err == (string *)0x0) goto LAB_00278537;
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &translations,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts_txs,
                     "\n");
  }
  ::std::__cxx11::string::append((string *)err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
LAB_00278537:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00278544:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&joints);
  StringAndIdMap::~StringAndIdMap(&joint_idMap);
  return false;
}

Assistant:

static bool ExportSkelAnimation(const Animation &anim, SkelAnimation *dst, std::string *err) {
  (void)err;
  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }

  auto float_to_uint = [](const float x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.f = x;
 
    return fp.u;
  };

  auto uint_to_float = [](const uint32_t x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.u = x;
 
    return fp.f;
  };

  // inf and nan(TimeCode::Default) aware upcast
  auto float_to_double = [](const float x) {
    if (std::isnan(x)) {
      return value::TimeCode::Default();
    }
    if (std::isinf(x)) {
      if (std::signbit(x)) {
        return -std::numeric_limits<double>::infinity();
      } else {
        return std::numeric_limits<double>::infinity();
      }
    }
    return double(x);
  };

  if (anim.channels_map.size()) {

    StringAndIdMap joint_idMap;
    for (const auto &channels : anim.channels_map)
    {
      uint64_t joint_id = uint64_t(joint_idMap.size());
      joint_idMap.add(channels.first, uint64_t(joint_id));
    }

    std::vector<value::token> joints(joint_idMap.size());
    for (const auto &channels : anim.channels_map) {
      joints[size_t(joint_idMap.at(channels.first))] = value::token(channels.first);
    }
    dst->joints = joints;

    bool no_tx_channel{true};
    bool no_rot_channel{true};
    bool no_scale_channel{true};

    bool all_joints_has_tx_channel{true};
    bool all_joints_has_rot_channel{true};
    bool all_joints_has_scale_channel{true};

    for (const auto &channels : anim.channels_map) {

      bool has_tx_channel;
      bool has_rot_channel;
      bool has_scale_channel;

      has_tx_channel = channels.second.count(AnimationChannel::ChannelType::Translation);
      has_rot_channel = channels.second.count(AnimationChannel::ChannelType::Rotation);
      has_scale_channel = channels.second.count(AnimationChannel::ChannelType::Scale);

      if (has_tx_channel) {
        no_tx_channel = false;
      } else {
        all_joints_has_tx_channel = false;
      }

      if (has_rot_channel) {
        no_rot_channel = false;
      } else {
        all_joints_has_rot_channel = false;
      }

      if (has_scale_channel) {
        no_scale_channel = false;
      } else {
        all_joints_has_scale_channel = false;
      }
    }

    if (!no_tx_channel && !all_joints_has_tx_channel) {
      PUSH_ERROR_AND_RETURN("translation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_rot_channel && !all_joints_has_rot_channel) {
      PUSH_ERROR_AND_RETURN("rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_scale_channel && !all_joints_has_scale_channel) {
      PUSH_ERROR_AND_RETURN("scale channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (no_tx_channel) {
      // Author static(default) value.
      std::vector<value::float3> translations;
      translations.assign(joints.size(), {1.0f, 1.0f, 1.0f});
      
      dst->translations.set_value(translations);
    } else {

      // All joints should have same timeCode.
      // First collect timeCodes for the first joint.
      //
      // when timeCode is NaN(value::TimeCode::Default), the behavior(key compare in unordered_set) is undefined,
      // so use byte representation.
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &tx_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(tx_it->second.translations.samples[t].t));
          }
        }
      }

      // key: timeCode. value: values for each joints.
      std::map<double, std::vector<value::float3>> ts_txs;
      for (const auto &tc : timeCodes) {
        ts_txs[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::float3> static_txs;

      // Pack channel values
      for (const auto &channels : anim.channels_map) {

        const auto &tx_it = channels.second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != channels.second.end()) {

          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            float tc = tx_it->second.translations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::float3> &txs = ts_txs.at(float_to_double(tc));
            // just in case
            if (joint_id > txs.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Internal error. joint_id {} exceeds # of joints {}", joint_id, txs.size()));
            }
            txs[size_t(joint_id)] = tx_it->second.translations.samples[t].value;
          }

          if (tx_it->second.translations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_txs.size()) {
              static_txs.resize(size_t(joint_id+1));
            }
            static_txs[size_t(joint_id)] = tx_it->second.translations.static_value.value(); 
          }
        }
      }

      Animatable<std::vector<value::float3>> aval;
      if (static_txs.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_txs);
      }

      for (const auto &s : ts_txs) {
        aval.add_sample(s.first, s.second);
      } 

      dst->translations.set_value(aval);
    }

    if (no_rot_channel) {
      // Author static(default) value.
      std::vector<value::quatf> rots;
      value::quatf q;
      q.imag = {0.0f, 0.0f, 0.0f};
      q.real = 1.0f;
      rots.assign(joints.size(), q);

      dst->rotations.set_value(rots);
      
    } else {

      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &rot_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(rot_it->second.rotations.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::quatf>> ts_rots;
      for (const auto &tc : timeCodes) {
        ts_rots[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::quatf> static_rots;

      for (const auto &channels : anim.channels_map) {

        const auto &rot_it = channels.second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != channels.second.end()) {

          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            float tc = rot_it->second.rotations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::quatf> &rots = ts_rots.at(float_to_double(tc));
            value::quatf v;
            v[0] = rot_it->second.rotations.samples[t].value[0];
            v[1] = rot_it->second.rotations.samples[t].value[1];
            v[2] = rot_it->second.rotations.samples[t].value[2];
            v[3] = rot_it->second.rotations.samples[t].value[3];
            rots[size_t(joint_id)] = v;
          }

          if (rot_it->second.rotations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_rots.size()) {
              static_rots.resize(size_t(joint_id+1));
            }
            value::quatf v;
            v[0] = rot_it->second.rotations.static_value.value()[0];
            v[1] = rot_it->second.rotations.static_value.value()[1];
            v[2] = rot_it->second.rotations.static_value.value()[2];
            v[3] = rot_it->second.rotations.static_value.value()[3];
            static_rots[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::quatf>> aval;
      if (static_rots.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_rots);
      }

      for (const auto &s : ts_rots) {
        aval.add_sample(s.first, s.second);
      } 

      dst->rotations.set_value(aval);
    }

    if (no_scale_channel) {
      // Author static(default) value.
      std::vector<value::half3> scales;
      scales.assign(joints.size(), {value::float_to_half_full(1.0f), value::float_to_half_full(1.0f), value::float_to_half_full(1.0f)});

      dst->scales.set_value(scales);
      
    } else {
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &scale_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            timeCodes.insert(float_to_uint(scale_it->second.scales.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::half3>> ts_scales;
      for (const auto &tc : timeCodes) {
        ts_scales[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::half3> static_scales;

      for (const auto &channels : anim.channels_map) {

        const auto &scale_it = channels.second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != channels.second.end()) {

          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            float tc = scale_it->second.scales.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::half3> &scales = ts_scales.at(float_to_double(tc));
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.samples[t].value[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.samples[t].value[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.samples[t].value[2]);
            scales[size_t(joint_id)] = v;
          }

          if (scale_it->second.scales.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_scales.size()) {
              static_scales.resize(size_t(joint_id+1));
            }
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.static_value.value()[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.static_value.value()[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.static_value.value()[2]);
            static_scales[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::half3>> aval;
      if (static_scales.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_scales);
      }

      for (const auto &s : ts_scales) {
        aval.add_sample(s.first, s.second);
      } 

      dst->scales.set_value(aval);
    }
  }

  if (anim.blendshape_weights_map.size()) {
    StringAndIdMap target_idMap;
    for (const auto &target : anim.blendshape_weights_map)
    {
      uint64_t target_id = uint64_t(target_idMap.size());
      target_idMap.add(target.first, uint64_t(target_id));
    }

    std::vector<value::token> blendShapes(target_idMap.size());
    for (const auto &target : anim.blendshape_weights_map) {
      blendShapes[size_t(target_idMap.at(target.first))] = value::token(target.first);
    }
    dst->blendShapes = blendShapes;

    std::unordered_set<uint32_t> timeCodes;
    {
      const auto &weights_it = anim.blendshape_weights_map.cbegin();
      for (size_t t = 0; t < weights_it->second.samples.size(); t++) {
        timeCodes.insert(float_to_uint(weights_it->second.samples[t].t));
      }
    }

    std::map<double, std::vector<float>> ts_weights;
    for (const auto &tc : timeCodes) {
      ts_weights[float_to_double(uint_to_float(tc))].resize(blendShapes.size()); 
    }
    std::vector<float> static_weights;

    for (const auto &target : anim.blendshape_weights_map) {

      for (size_t t = 0; t < target.second.samples.size(); t++) {
        float tc = target.second.samples[t].t;
        if (!timeCodes.count(float_to_uint(tc))) {
          PUSH_ERROR_AND_RETURN(fmt::format("All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}", tc, target.first));
        }
        uint64_t target_id = target_idMap.at(target.first);

        std::vector<float> &weights = ts_weights.at(float_to_double(tc));
        //DCOUT("weights.size " << weights.size() << ", target_id " << target_id);
        weights[size_t(target_id)] = target.second.samples[t].value;
      }

      if (target.second.static_value) {
        uint64_t target_id = target_idMap.at(target.first);
        if ((target_id +1) > static_weights.size()) {
          static_weights.resize(size_t(target_id+1));
        }
        static_weights[size_t(target_id)] = target.second.static_value.value(); 
      }
    }

    Animatable<std::vector<float>> aval;
    if (static_weights.size() == blendShapes.size()) {
      // Author static(default) value.
      aval.set_default(static_weights);
    }

    for (const auto &s : ts_weights) {
      aval.add_sample(s.first, s.second);
    } 

    dst->blendShapeWeights.set_value(aval);
  } else {
    // Just author 'blendShapeWeights' without value.
    dst->blendShapeWeights.set_value_empty();
  }

  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }
  return true;
}